

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_bKGD(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  uint error_2;
  uint error_1;
  uint error;
  uchar *chunk;
  LodePNGInfo *info_local;
  ucvector *out_local;
  
  _error_1 = (uchar *)0x0;
  chunk = (uchar *)info;
  info_local = (LodePNGInfo *)out;
  if (((info->color).colortype == LCT_GREY) || ((info->color).colortype == LCT_GREY_ALPHA)) {
    uVar1 = lodepng_chunk_init((uchar **)&error_1,out,2,"bKGD");
    if (uVar1 != 0) {
      return uVar1;
    }
    _error_1[8] = (uchar)((uint)*(undefined4 *)(chunk + 0x3c) >> 8);
    _error_1[9] = (uchar)*(undefined4 *)(chunk + 0x3c);
  }
  else if (((info->color).colortype == LCT_RGB) || ((info->color).colortype == LCT_RGBA)) {
    uVar1 = lodepng_chunk_init((uchar **)&error_1,out,6,"bKGD");
    if (uVar1 != 0) {
      return uVar1;
    }
    _error_1[8] = (uchar)((uint)*(undefined4 *)(chunk + 0x3c) >> 8);
    _error_1[9] = (uchar)*(undefined4 *)(chunk + 0x3c);
    _error_1[10] = (uchar)((uint)*(undefined4 *)(chunk + 0x40) >> 8);
    _error_1[0xb] = (uchar)*(undefined4 *)(chunk + 0x40);
    _error_1[0xc] = (uchar)((uint)*(undefined4 *)(chunk + 0x44) >> 8);
    _error_1[0xd] = (uchar)*(undefined4 *)(chunk + 0x44);
  }
  else if ((info->color).colortype == LCT_PALETTE) {
    uVar1 = lodepng_chunk_init((uchar **)&error_1,out,1,"bKGD");
    if (uVar1 != 0) {
      return uVar1;
    }
    _error_1[8] = (uchar)*(undefined4 *)(chunk + 0x3c);
  }
  if (_error_1 != (uchar *)0x0) {
    lodepng_chunk_generate_crc(_error_1);
  }
  return 0;
}

Assistant:

static unsigned addChunk_bKGD(ucvector* out, const LodePNGInfo* info) {
  unsigned char* chunk = 0;
  if(info->color.colortype == LCT_GREY || info->color.colortype == LCT_GREY_ALPHA) {
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 2, "bKGD"));
    chunk[8] = (unsigned char)(info->background_r >> 8);
    chunk[9] = (unsigned char)(info->background_r & 255);
  } else if(info->color.colortype == LCT_RGB || info->color.colortype == LCT_RGBA) {
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 6, "bKGD"));
    chunk[8] = (unsigned char)(info->background_r >> 8);
    chunk[9] = (unsigned char)(info->background_r & 255);
    chunk[10] = (unsigned char)(info->background_g >> 8);
    chunk[11] = (unsigned char)(info->background_g & 255);
    chunk[12] = (unsigned char)(info->background_b >> 8);
    chunk[13] = (unsigned char)(info->background_b & 255);
  } else if(info->color.colortype == LCT_PALETTE) {
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 1, "bKGD"));
    chunk[8] = (unsigned char)(info->background_r & 255); /*palette index*/
  }
  if(chunk) lodepng_chunk_generate_crc(chunk);
  return 0;
}